

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                *m1,Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                    *m2)

{
  Column_container *this;
  int iVar1;
  pointer puVar2;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  *pMVar3;
  pointer pvVar4;
  mapped_type *pmVar5;
  Column_support *pCVar6;
  ulong uVar7;
  node_ptr plVar8;
  ulong uVar9;
  uint uVar10;
  Underlying_matrix *this_00;
  anon_class_1_0_00000001 test;
  undefined4 local_368;
  int local_364;
  undefined **local_360;
  ulong local_358;
  shared_count sStack_350;
  undefined4 ***local_348;
  undefined **local_340;
  undefined1 local_338;
  undefined8 *local_330;
  value_type *local_328;
  undefined4 *local_320;
  int *local_318;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  *local_310;
  undefined **local_308;
  char *local_300;
  undefined8 *local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  shared_count sStack_2d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  undefined4 **local_288;
  char *local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_310 = m2;
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>>
            ();
  if (orderedBoundaries.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      orderedBoundaries.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 1;
    uVar7 = 0;
    do {
      Gudhi::persistence_matrix::
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
      ::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                (&local_248,
                 (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
                  *)&m1->matrix_,uVar10 - 1,
                 orderedBoundaries.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,-1);
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar7 = (ulong)uVar10;
      uVar9 = ((long)orderedBoundaries.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)orderedBoundaries.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar10 = uVar10 + 1;
    } while (uVar7 <= uVar9 && uVar9 - uVar7 != 0);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x220);
  local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
  local_308 = &PTR__lazy_ostream_0022c060;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  iVar1 = (int)(m1->matrix_).matrix_._M_h._M_element_count;
  boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_318;
  local_318 = (int *)CONCAT44(local_318._4_4_,iVar1);
  local_288 = &local_320;
  local_320 = (undefined4 *)CONCAT44(local_320._4_4_,7);
  local_2e8 = iVar1 == 7;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_328 = &boundary1;
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022bfa8;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_348 = &local_288;
  local_358 = local_358 & 0xffffffffffffff00;
  local_360 = &PTR__lazy_ostream_0022c020;
  sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_73d13;
  boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1eb329;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
  ::anon_class_1_0_00000001::operator()(&test,m1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary2,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary1,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  puVar2 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = orderedBoundaries.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar2 != (pointer)0x0) {
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar2,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    pvVar4 = orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x228);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  this = &(local_310->matrix_).matrix_;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  pCVar6 = &pmVar5->column_;
  plVar8 = (node_ptr)pCVar6;
  do {
    plVar8 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar8 == (node_ptr)pCVar6) break;
  } while (*(int *)&plVar8[1].next_ != 2);
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f3150;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_328 = (value_type *)&local_308;
  local_360._0_1_ = plVar8 == (node_ptr)pCVar6;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x229);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  pCVar6 = &pmVar5->column_;
  plVar8 = (node_ptr)pCVar6;
  do {
    plVar8 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar8 == (node_ptr)pCVar6) break;
  } while (*(int *)&plVar8[1].next_ != 1);
  local_360._0_1_ = plVar8 != (node_ptr)pCVar6;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f3167;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a8 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x22a);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,3);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  pCVar6 = &pmVar5->column_;
  plVar8 = (node_ptr)pCVar6;
  do {
    plVar8 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar8 == (node_ptr)pCVar6) break;
  } while (*(int *)&plVar8[1].next_ != 3);
  local_360._0_1_ = plVar8 != (node_ptr)pCVar6;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f317f;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d8 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x22b);
  local_340 = (undefined **)((ulong)local_340 & 0xffffffff00000000);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  plVar8 = (pmVar5->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_360._0_1_ = plVar8 != (node_ptr)&pmVar5->column_ && plVar8 != (node_ptr)0x0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f3197;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_108 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x22c);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,1);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  plVar8 = (pmVar5->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_360._0_1_ = plVar8 != (node_ptr)&pmVar5->column_ && plVar8 != (node_ptr)0x0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f31ad;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_138 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x22d);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  plVar8 = (pmVar5->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_360._0_1_ = plVar8 != (node_ptr)&pmVar5->column_ && plVar8 != (node_ptr)0x0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f31c3;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_168 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x22e);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,3);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  plVar8 = (pmVar5->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_360._0_1_ = plVar8 != (node_ptr)&pmVar5->column_ && plVar8 != (node_ptr)0x0;
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f31d9;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x22f);
  local_340 = (undefined **)CONCAT44(local_340._4_4_,4);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,(key_type *)&local_340);
  plVar8 = (pmVar5->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  local_360 = (undefined **)
              CONCAT71(local_360._1_7_,
                       plVar8 != (node_ptr)&pmVar5->column_ && plVar8 != (node_ptr)0x0);
  local_358 = 0;
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_308 = (undefined **)0x1f31ef;
  local_300 = "";
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022c220;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_328 = (value_type *)&local_308;
  boost::test_tools::tt_detail::report_assertion(&local_360,&local_340,&local_1d0,0x22f,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x231);
  pMVar3 = local_310;
  local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
  local_308 = &PTR__lazy_ostream_0022c060;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
  local_318 = &local_364;
  local_320 = &local_368;
  local_2e8 = local_364 == 5;
  local_368 = 5;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_338 = 0;
  local_358 = local_358 & 0xffffffffffffff00;
  local_288 = (undefined4 **)0x1eb2b6;
  local_280 = "";
  local_340 = &PTR__lazy_ostream_0022bfa8;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_328 = (value_type *)&local_318;
  local_360 = &PTR__lazy_ostream_0022c020;
  sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_348 = (undefined4 ***)&local_320;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  this_00 = &pMVar3->matrix_;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
  ::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&local_260,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
              *)this_00,(pMVar3->matrix_).nextIndex_,&boundary1,-1);
  if (local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x233);
  pMVar3 = local_310;
  local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
  local_308 = &PTR__lazy_ostream_0022c060;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
  local_2e8 = local_364 == 6;
  local_368 = 6;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_338 = 0;
  local_358 = local_358 & 0xffffffffffffff00;
  local_288 = (undefined4 **)0x1eb2b6;
  local_280 = "";
  local_318 = &local_364;
  local_340 = &PTR__lazy_ostream_0022bfa8;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_328 = (value_type *)&local_318;
  local_320 = &local_368;
  local_360 = &PTR__lazy_ostream_0022c020;
  sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_348 = (undefined4 ***)&local_320;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
  ::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&local_278,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
              *)this_00,(pMVar3->matrix_).nextIndex_,&boundary2,-1);
  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x235);
  pMVar3 = local_310;
  local_300 = (char *)((ulong)local_300 & 0xffffffffffffff00);
  local_308 = &PTR__lazy_ostream_0022c060;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_364 = (int)(local_310->matrix_).matrix_._M_h._M_element_count;
  local_2e8 = local_364 == 7;
  local_368 = 7;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined4 **)0x1eb2b6;
  local_280 = "";
  local_318 = &local_364;
  local_338 = 0;
  local_340 = &PTR__lazy_ostream_0022bfa8;
  local_330 = &boost::unit_test::lazy_ostream::inst;
  local_328 = (value_type *)&local_318;
  local_320 = &local_368;
  local_358 = local_358 & 0xffffffffffffff00;
  local_360 = &PTR__lazy_ostream_0022c020;
  sStack_350.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_348 = (undefined4 ***)&local_320;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
  ::anon_class_1_0_00000001::operator()(&test,pMVar3);
  if (boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_chain_boundary_insertion(Matrix& m1, Matrix& m2) {
  auto test = [](Matrix& m) {
    BOOST_CHECK(m.is_zero_entry(1, 2));
    BOOST_CHECK(!m.is_zero_entry(1, 1));
    BOOST_CHECK(!m.is_zero_entry(3, 3));
    BOOST_CHECK(!m.is_zero_column(0));
    BOOST_CHECK(!m.is_zero_column(1));
    BOOST_CHECK(!m.is_zero_column(2));
    BOOST_CHECK(!m.is_zero_column(3));
    BOOST_CHECK(!m.is_zero_column(4));
    BOOST_CHECK(!m.is_zero_column(5));
    BOOST_CHECK(!m.is_zero_column(6));

    BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

    BOOST_CHECK_EQUAL(m.get_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_pivot(6), 6);

    BOOST_CHECK_EQUAL(m.get_column_with_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(6), 6);
  };

  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_indexed_by_position<Matrix>())
      m1.insert_boundary(orderedBoundaries[i]);
    else
      m1.insert_boundary(i, orderedBoundaries[i]);
  }
  BOOST_CHECK_EQUAL(m1.get_number_of_columns(), 7);
  test(m1);

  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  BOOST_CHECK(m2.is_zero_entry(1, 2));
  BOOST_CHECK(!m2.is_zero_entry(1, 1));
  BOOST_CHECK(!m2.is_zero_entry(3, 3));
  BOOST_CHECK(!m2.is_zero_column(0));
  BOOST_CHECK(!m2.is_zero_column(1));
  BOOST_CHECK(!m2.is_zero_column(2));
  BOOST_CHECK(!m2.is_zero_column(3));
  BOOST_CHECK(!m2.is_zero_column(4));

  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 5);
  m2.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 6);
  m2.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 7);
  test(m2);
}